

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted-payload.c
# Opt level: O2

int ndn_parse_encrypted_payload
              (uint8_t *input,uint32_t input_size,uint8_t *output,uint32_t *output_size,
              uint32_t aes_key_id)

{
  uint32_t input_size_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  ndn_aes_key_t *aes_key;
  long lVar4;
  uint8_t *aes_iv;
  ulong uVar5;
  uint8_t *input_value;
  uint32_t local_4c;
  undefined1 auStack_48 [4];
  uint32_t type;
  uint32_t local_40;
  uint local_3c;
  uint32_t local_38;
  uint32_t local_34 [2];
  uint32_t length;
  
  local_4c = 0;
  local_34[0] = 0;
  local_3c = 0;
  input_size_00 = 0;
  aes_iv = (uint8_t *)0x0;
  input_value = (uint8_t *)0x0;
  _auStack_48 = input;
  local_40 = input_size;
  local_38 = aes_key_id;
  do {
    iVar2 = decoder_get_var((ndn_decoder_t *)auStack_48,&local_4c);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = decoder_get_var((ndn_decoder_t *)auStack_48,local_34);
    if (iVar2 != 0) {
      return iVar2;
    }
    if (local_4c == 0x81) {
      uVar3 = local_3c + 4;
      uVar5 = 0;
      uVar1 = local_3c;
      if (uVar3 <= local_40) {
        uVar5 = 0;
        lVar4 = 0x20;
        while (uVar1 = uVar3, lVar4 != 0) {
          lVar4 = lVar4 + -8;
          uVar5 = (ulong)((int)uVar5 + ((uint)_auStack_48[local_3c] << ((byte)lVar4 & 0x1f)));
          local_3c = local_3c + 1;
        }
      }
      local_3c = uVar1;
      iVar2 = (int)uVar5 - local_38;
      uVar3 = local_3c;
      if (iVar2 != 0) {
        printf("ERROR: %s, L%d: ","ndn_parse_encrypted_payload",0x75);
        printf("[ENCODING] Received KeyID %u and Input KeyID %u not match\n",uVar5,(ulong)local_38);
        return iVar2;
      }
    }
    else {
      if (local_4c == 0x88) {
        input_value = _auStack_48 + local_3c;
        uVar3 = local_34[0] + local_3c;
        input_size_00 = local_34[0];
      }
      else {
        if (local_4c != 0x87) {
          uVar3 = local_34[0] + local_3c;
          if (local_40 < local_34[0] + local_3c) {
            uVar3 = local_3c;
          }
          goto LAB_00109431;
        }
        if (local_34[0] != 0x10) {
          return -0xd;
        }
        aes_iv = _auStack_48 + local_3c;
        uVar3 = local_3c + 0x10;
      }
      if (local_40 < uVar3) {
        uVar3 = local_3c;
      }
    }
LAB_00109431:
    local_3c = uVar3;
    if ((aes_iv != (uint8_t *)0x0) && (input_value != (uint8_t *)0x0)) {
      aes_key = ndn_key_storage_get_aes_key(local_38);
      if (aes_key == (ndn_aes_key_t *)0x0) {
        return -0x49;
      }
      iVar2 = ndn_aes_cbc_decrypt(input_value,input_size_00,output,output_size,aes_iv,aes_key);
      return iVar2;
    }
  } while( true );
}

Assistant:

int
ndn_parse_encrypted_payload(const uint8_t* input, uint32_t input_size,
                            uint8_t* output, uint32_t* output_size, uint32_t aes_key_id)
{
  int ret_val = -1;
  uint32_t type = 0;
  uint32_t length = 0;
  uint32_t encrypted_payload_length = 0;
  const uint8_t* iv = NULL;
  const uint8_t* encrypted_payload = NULL;
  ndn_decoder_t decoder;
  decoder_init(&decoder, input, input_size);

  do {
    ret_val = decoder_get_type(&decoder, &type);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = decoder_get_length(&decoder, &length);
    if (ret_val != NDN_SUCCESS) return ret_val;
    if (type == TLV_AC_AES_IV) {
      if (length != NDN_AES_BLOCK_SIZE) return NDN_WRONG_TLV_LENGTH;
      iv = decoder.input_value + decoder.offset;
      decoder_move_forward(&decoder, length);
    }
    else if (type == TLV_AC_KEYID) {
      uint32_t keyid = 0;
      decoder_get_uint32_value(&decoder, &keyid);
      if (keyid != aes_key_id) {
        NDN_LOG_ERROR("[ENCODING] Received KeyID %u and Input KeyID %u not match\n", keyid, aes_key_id);
        return keyid - aes_key_id;
      }
    }
    else if (type == TLV_AC_ENCRYPTED_PAYLOAD) {
      encrypted_payload = decoder.input_value + decoder.offset;
      encrypted_payload_length = length;
      decoder_move_forward(&decoder, length);
    }
    else {
      decoder_move_forward(&decoder, length);
    }
  }
  while (iv == NULL || encrypted_payload == NULL);

  ndn_aes_key_t* key = ndn_key_storage_get_aes_key(aes_key_id);
  if (key == NULL) {
    return NDN_AC_KEY_NOT_FOUND;
  }
  ret_val = ndn_aes_cbc_decrypt(encrypted_payload, encrypted_payload_length,
                                output, output_size, iv, key);
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}